

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Catch::Detail::splitReporterSpec_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Detail *this,StringRef reporterSpec)

{
  size_type shortened_size;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar3 = reporterSpec.m_start;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (char *)0x0;
  do {
    pcVar5 = pcVar2;
    uVar1 = (long)pcVar3 - (long)pcVar5;
    pcVar2 = pcVar5;
    if (pcVar3 < pcVar5 || uVar1 == 0) break;
LAB_00147ac9:
    do {
      pcVar6 = pcVar2;
      if (this[(long)pcVar2] != (Detail)0x3a) {
        pcVar2 = pcVar2 + 1;
        pcVar6 = pcVar3;
        if (pcVar2 != pcVar3) goto LAB_00147ac9;
      }
      pcVar2 = pcVar6 + 1;
      if (pcVar3 <= pcVar2) {
        pcVar6 = (char *)0xffffffffffffffff;
        break;
      }
    } while (this[(long)pcVar2] != (Detail)0x3a);
    uVar4 = (long)pcVar6 - (long)pcVar5;
    if (uVar1 < (ulong)((long)pcVar6 - (long)pcVar5)) {
      uVar4 = uVar1;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,this + (long)pcVar5,this + (long)pcVar5 + uVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = pcVar6 + 2;
  } while (pcVar6 != (char *)0xffffffffffffffff);
  if (pcVar5 == pcVar3) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> splitReporterSpec( StringRef reporterSpec ) {
            static constexpr auto separator = "::";
            static constexpr size_t separatorSize = 2;

            size_t separatorPos = 0;
            auto findNextSeparator = [&reporterSpec]( size_t startPos ) {
                static_assert(
                    separatorSize == 2,
                    "The code below currently assumes 2 char separator" );

                auto currentPos = startPos;
                do {
                    while ( currentPos < reporterSpec.size() &&
                            reporterSpec[currentPos] != separator[0] ) {
                        ++currentPos;
                    }
                    if ( currentPos + 1 < reporterSpec.size() &&
                         reporterSpec[currentPos + 1] == separator[1] ) {
                        return currentPos;
                    }
                    ++currentPos;
                } while ( currentPos < reporterSpec.size() );

                return static_cast<size_t>( -1 );
            };

            std::vector<std::string> parts;

            while ( separatorPos < reporterSpec.size() ) {
                const auto nextSeparator = findNextSeparator( separatorPos );
                parts.push_back( static_cast<std::string>( reporterSpec.substr(
                    separatorPos, nextSeparator - separatorPos ) ) );

                if ( nextSeparator == static_cast<size_t>( -1 ) ) {
                    break;
                }
                separatorPos = nextSeparator + separatorSize;
            }

            // Handle a separator at the end.
            // This is not a valid spec, but we want to do validation in a
            // centralized place
            if ( separatorPos == reporterSpec.size() ) {
                parts.emplace_back();
            }

            return parts;
        }